

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O2

void __thiscall BibIndexer::lintEntry(BibIndexer *this,TSNode *entryNode)

{
  bool bVar1;
  uint32_t childCount;
  size_type sVar2;
  u16string *this_00;
  optional<Style::Entry_*> oVar3;
  allocator<char> local_ed;
  uint32_t i;
  u16string local_e8;
  u16string entryKey;
  vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  local_a8;
  TSNode keyNode;
  u16string entryName;
  TSNode entryNameNode;
  
  entryName._M_dataplus._M_p = (pointer)&entryName.field_2;
  entryName._M_string_length = 0;
  entryName.field_2._M_local_buf[0] = L'\0';
  local_a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  childCount = ts_node_named_child_count(*entryNode);
  i = 0;
  bVar1 = getEntryName(this,&entryName,entryNode,&i,childCount);
  if (!bVar1) goto LAB_0017189d;
  if (entryName._M_string_length == 0) {
    ts_node_child(&entryNameNode,*entryNode,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&entryKey,"No entry name",(allocator<char> *)&keyNode);
    addError(this,&entryNameNode,MissingEntryName,(string *)&entryKey);
    this_00 = &entryKey;
  }
  else {
    oVar3 = Style::Style::getEntry(this->style,&entryName);
    ts_node_named_child(&entryNameNode,*entryNode,i);
    if (((undefined1  [16])
         oVar3.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
         super__Optional_payload_base<Style::Entry_*> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      entryKey._M_dataplus._M_p = (pointer)&entryKey.field_2;
      entryKey._M_string_length = 0;
      entryKey.field_2._M_local_buf[0] = L'\0';
      bVar1 = getEntryKey(this,&entryKey,entryNode,&i,childCount);
      if (bVar1) {
        ts_node_named_child(&keyNode,*entryNode,i);
        if (entryKey._M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"Key is empty",&local_ed);
          addWarning(this,&entryNameNode,EmptyKey,(string *)&local_e8);
LAB_001717e6:
          std::__cxx11::string::~string((string *)&local_e8);
        }
        else {
          sVar2 = std::
                  _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->keys)._M_h,&entryKey);
          if (sVar2 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"Duplicate key name",&local_ed);
            addWarning(this,&keyNode,DuplicateKey,(string *)&local_e8);
            goto LAB_001717e6;
          }
          std::__cxx11::u16string::u16string((u16string *)&local_e8,&entryKey);
          std::__detail::
          _Insert_base<std::__cxx11::u16string,std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>,std::__detail::_Identity,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::insert<std::__cxx11::u16string_const*>
                    ((_Insert_base<std::__cxx11::u16string,std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>,std::__detail::_Identity,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&this->keys,&local_e8,&entryKey);
          std::__cxx11::u16string::~u16string((u16string *)&local_e8);
        }
        bVar1 = hasNonASCIIchar(&entryKey);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"Non ASCII characters detected in key",&local_ed);
          addWarning(this,&keyNode,NonASCIIKey,(string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        lintFields(this,entryNode,&local_a8,&i,childCount);
        postProcessEntry(this,&entryNameNode,
                         oVar3.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
                         super__Optional_payload_base<Style::Entry_*>._M_payload._M_value,&local_a8)
        ;
      }
      std::__cxx11::u16string::~u16string((u16string *)&entryKey);
      goto LAB_0017189d;
    }
    UtfHandler::utf16to8((string *)&local_e8,&this->utf,&entryName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyNode,
                   "Entry ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entryKey,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyNode,
                   " is unexpected");
    addWarning(this,&entryNameNode,UnknownEntry,(string *)&entryKey);
    std::__cxx11::string::~string((string *)&entryKey);
    std::__cxx11::string::~string((string *)&keyNode);
    this_00 = &local_e8;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0017189d:
  std::
  vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ::~vector(&local_a8);
  std::__cxx11::u16string::~u16string((u16string *)&entryName);
  return;
}

Assistant:

void BibIndexer::lintEntry (TSNode &entryNode) {
    // TODO: Work out exactly how much gets linted
    //   when missing things such as entry name, key, etc
    //   (currently we give up as soon as one doesn't exist)

    u16string entryName {};

    vector<std::pair<u16string, TSNode>> observedFields {}; // we're likely to have at most 10, so a vector should be better than a map

    uint32_t childCount = ts_node_named_child_count(entryNode);
    uint32_t i = 0;

    bool foundEntryName = getEntryName(entryName, entryNode, i, childCount);
    if (!foundEntryName) return;

    if (entryName.empty()) {
        TSNode entryNameNode = ts_node_child(entryNode, 0);
        addError(entryNameNode, Error::MissingEntryName, "No entry name");
        return;
    }

    std::optional<Style::Entry *> oentry = style->getEntry(entryName);

    TSNode entryNameNode = ts_node_named_child(entryNode, i);

    if (!oentry) {
        addWarning(entryNameNode, Warning::UnknownEntry, "Entry " + utf.utf16to8(entryName) + " is unexpected");
        return;
    }

    Style::Entry &entry = *oentry.value();

    u16string entryKey;
    bool foundEntryKey = getEntryKey(entryKey, entryNode, i, childCount);
    if (!foundEntryKey) return;

    TSNode keyNode = ts_node_named_child(entryNode, i);

    if (entryKey.empty()) {
        addWarning(entryNameNode, Warning::EmptyKey, "Key is empty");
    } else {
        if (keys.count(entryKey) > 0) {
            addWarning(keyNode, Warning::DuplicateKey, "Duplicate key name");
        } else {
            keys.insert({ entryKey });
        }
    }

    if (hasNonASCIIchar(entryKey)) {
        addWarning(keyNode, Warning::NonASCIIKey, "Non ASCII characters detected in key");
    }

    lintFields(entryNode, observedFields, i, childCount);

    if (oentry) {
        postProcessEntry(entryNameNode, entry, observedFields);
    }
}